

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint ON_MeshNgon::IsValid
               (ON_MeshNgon *ngon,uint ngon_index,ON_TextLog *text_logx,uint mesh_vertex_count,
               uint mesh_face_count,ON_MeshFace *mesh_F,
               ON_SimpleArray<unsigned_int> *workspace_buffer)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ON_MeshFace *this;
  ON_TextLog *this_00;
  
  if (-1 < workspace_buffer->m_capacity) {
    workspace_buffer->m_count = 0;
  }
  if (ngon == (ON_MeshNgon *)0x0) {
    return 1;
  }
  this_00 = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  if (ngon->m_Vcount < 3) {
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
    pcVar6 = "ON_Mesh.Ngon(%u)->m_Vcount < 3.\n";
  }
  else if (ngon->m_Fcount == 0) {
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
    pcVar6 = "ON_Mesh.Ngon(%u)->m_Fcount < 1.\n";
  }
  else if (ngon->m_vi == (uint *)0x0) {
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
    pcVar6 = "ON_Mesh.Ngon(%u)->m_vi is nullptr.\n";
  }
  else if (ngon->m_fi == (uint *)0x0) {
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
    pcVar6 = "ON_Mesh.Ngon(%u)->m_fi is nullptr.\n";
  }
  else {
    uVar3 = 0;
    do {
      if (mesh_vertex_count <= ngon->m_vi[uVar3]) {
        if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
        pcVar6 = "ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n";
        goto LAB_004ff070;
      }
      uVar3 = uVar3 + 1;
    } while (ngon->m_Vcount != (uint)uVar3);
    if (ngon->m_Fcount != 0) {
      uVar3 = 0;
      do {
        if (mesh_face_count <= ngon->m_fi[uVar3]) {
          if (this_00 != (ON_TextLog *)0x0) {
            pcVar6 = "ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n";
LAB_004ff070:
            ON_TextLog::Print(this_00,pcVar6,(ulong)ngon_index,uVar3 & 0xffffffff);
          }
          goto joined_r0x004ff15f;
        }
        uVar3 = uVar3 + 1;
      } while (ngon->m_Fcount != (uint)uVar3);
    }
    if (mesh_F == (ON_MeshFace *)0x0) {
      return 1;
    }
    if (ngon->m_Fcount == 1) {
      uVar15 = ngon->m_Vcount;
      uVar3 = (ulong)uVar15;
      if (uVar15 - 3 < 2) {
        this = mesh_F + *ngon->m_fi;
        bVar2 = ON_MeshFace::IsValid(this,mesh_vertex_count);
        if (bVar2) {
          bVar2 = uVar3 == 0;
          if (!bVar2) {
            puVar1 = ngon->m_vi;
            lVar13 = 3;
            do {
              lVar7 = lVar13;
              if (this->vi[0] == puVar1[lVar7 + -3]) {
                lVar13 = lVar7 + -2;
                if (-uVar3 + lVar7 == 2) {
                  lVar13 = 0;
                }
                if (this->vi[1] == puVar1[lVar13]) {
                  if (this->vi[2] == puVar1[(ulong)((uint)lVar7 - 1) % uVar3]) {
                    if (uVar3 == 4) {
                      if (this->vi[3] == puVar1[(uint)lVar7 & 3]) {
                        uVar15 = 4;
                        goto LAB_004ff297;
                      }
                    }
                    else if ((uVar15 == 3) && (this->vi[3] == this->vi[2])) {
                      uVar15 = 3;
LAB_004ff297:
                      bVar2 = false;
                      goto LAB_004ff0b4;
                    }
                  }
                }
              }
              lVar13 = lVar7 + 1;
            } while (-uVar3 + lVar7 != 2);
            bVar2 = uVar3 <= lVar7 - 2U;
          }
LAB_004ff0b1:
          uVar15 = 0;
        }
        else {
          if (this_00 != (ON_TextLog *)0x0) {
            ON_TextLog::Print(this_00,"ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n",(ulong)ngon_index);
          }
          bVar2 = false;
          uVar15 = 0;
          if (((ulong)text_logx & 1) == 0) {
            ON_IsNotValid();
            bVar2 = false;
            goto LAB_004ff0b1;
          }
        }
LAB_004ff0b4:
        if (!bVar2) {
          return uVar15;
        }
      }
    }
    uVar3 = (ulong)(ngon->m_Fcount << 3);
    if ((ulong)(long)workspace_buffer->m_capacity < uVar3) {
      ON_SimpleArray<unsigned_int>::SetCapacity(workspace_buffer,uVar3);
    }
    puVar1 = workspace_buffer->m_a;
    uVar15 = ngon->m_Fcount;
    if ((ulong)uVar15 == 0) {
      uVar5 = 0;
    }
    else {
      puVar4 = ngon->m_fi;
      uVar3 = 0;
      uVar5 = 0;
      do {
        uVar9 = puVar4[uVar3];
        uVar10 = 0xfffffffffffffffc;
        uVar11 = mesh_F[uVar9].vi[3];
        do {
          uVar8 = *(uint *)((long)mesh_F[uVar9].vi + uVar10 + 4);
          uVar12 = uVar8;
          if ((uVar11 < uVar8) || (bVar2 = uVar8 < uVar11, uVar12 = uVar11, uVar11 = uVar8, bVar2))
          {
            uVar14 = (ulong)uVar5;
            puVar1[uVar14 * 2] = uVar11;
            uVar5 = uVar5 + 1;
            puVar1[uVar14 * 2 + 1] = uVar12;
          }
          uVar10 = uVar10 + 4;
          uVar11 = uVar8;
        } while (uVar10 < 0xc);
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar15);
    }
    if (uVar5 < ngon->m_Vcount) {
      if (this_00 != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this_00,"ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",
                          (ulong)ngon_index);
      }
      goto joined_r0x004ff15f;
    }
    ON_qsort(puVar1,(ulong)uVar5,8,compare2u);
    if (uVar5 == 0) {
      uVar15 = 0;
    }
    else {
      uVar9 = 0;
      uVar3 = 0;
      do {
        uVar8 = uVar9 + 1;
        uVar15 = puVar1[(ulong)uVar9 * 2];
        uVar11 = puVar1[(ulong)uVar9 * 2 + 1];
        if (((uVar8 < uVar5) && (uVar15 == puVar1[(ulong)uVar8 * 2])) &&
           (uVar11 == puVar1[(ulong)uVar8 * 2 + 1])) {
          uVar8 = uVar9 + 2;
          uVar9 = uVar8;
          if (uVar8 < uVar5) {
            puVar4 = puVar1 + (ulong)uVar8 * 2 + 1;
            do {
              uVar9 = uVar8;
              if ((uVar15 != puVar4[-1]) || (uVar11 != *puVar4)) break;
              uVar8 = uVar8 + 1;
              puVar4 = puVar4 + 2;
              uVar9 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          puVar1[uVar3 * 2] = uVar15;
          puVar1[uVar3 * 2 + 1] = uVar11;
          uVar3 = (ulong)((int)uVar3 + 1);
          uVar9 = uVar8;
        }
        uVar15 = (uint)uVar3;
      } while (uVar9 < uVar5);
    }
    if (ngon->m_Vcount <= uVar15) {
      ON_SortUnsignedIntArray(quick_sort,puVar1,(ulong)(uVar15 * 2));
      if (ngon->m_Vcount == 0) {
        return uVar15;
      }
      uVar3 = 0;
      while (puVar4 = ON_BinarySearchUnsignedIntArray(ngon->m_vi[uVar3],puVar1,(ulong)(uVar15 * 2)),
            puVar4 != (uint *)0x0) {
        uVar3 = uVar3 + 1;
        if (ngon->m_Vcount <= uVar3) {
          return uVar15;
        }
      }
      if (this_00 != (ON_TextLog *)0x0) {
        ON_TextLog::Print(this_00,"ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",
                          (ulong)ngon_index,uVar3 & 0xffffffff);
      }
      goto joined_r0x004ff15f;
    }
    if (this_00 == (ON_TextLog *)0x0) goto joined_r0x004ff15f;
    pcVar6 = "ON_Mesh.Ngon(%u) has invalid face or vertex list.\n";
  }
  ON_TextLog::Print(this_00,pcVar6,(ulong)ngon_index);
joined_r0x004ff15f:
  if (((ulong)text_logx & 1) == 0) {
    ON_IsNotValid();
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::IsValid(
  const ON_MeshNgon* ngon,
  unsigned int ngon_index,
  ON_TextLog* text_logx,
  unsigned int mesh_vertex_count,
  unsigned int mesh_face_count,
  const ON_MeshFace* mesh_F,
  ON_SimpleArray< unsigned int >& workspace_buffer
  )
{
  workspace_buffer.SetCount(0);
  if ( nullptr == ngon )
    return true; // null ngons are ok

  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  if (ngon->m_Vcount < 3)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Vcount < 3.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if (ngon->m_Fcount < 1)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Fcount < 1.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_vi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_vi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_fi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_fi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if (ngon->m_vi[nvi] >= mesh_vertex_count)
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];
    if (fi >= mesh_face_count)
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n", ngon_index, nfi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  if (nullptr == mesh_F)
  {
    // mesh faces are required to check the boundary
    return true;
  }

  if (1 == ngon->m_Fcount && ngon->m_Vcount >= 3 && ngon->m_Vcount <= 4)
  {
    // fast test for a valid single face ngon
    unsigned int fi = ngon->m_fi[0];
    if (false == mesh_F[fi].IsValid(mesh_vertex_count))
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n", ngon_index);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
    const unsigned int* fvi = (const unsigned int*)mesh_F[fi].vi;
    for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
    {
      if (fvi[0] == ngon->m_vi[nvi] && fvi[1] == ngon->m_vi[(nvi+1)%ngon->m_Vcount] && fvi[2] == ngon->m_vi[(nvi+2)%ngon->m_Vcount])
      {
        if (3 == ngon->m_Vcount && fvi[3] == fvi[2])
          return 3;
        if (4 == ngon->m_Vcount && fvi[3] == ngon->m_vi[(nvi+3)%ngon->m_Vcount])
          return 4;
      }
    }
    // boundary may be reversed
  }

  unsigned int* workspace = workspace_buffer.Reserve(8*ngon->m_Fcount);
  ON_2udex* edges = (ON_2udex*)workspace;
  unsigned int edge_count = 0;
  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];

    const unsigned int* fvi = (const unsigned int*)(mesh_F[fi].vi);
    unsigned int vi0;
    unsigned int vi1 = fvi[3];
    for (const unsigned int* fvi1 = fvi + 4; fvi < fvi1; fvi++)
    {
      vi0 = vi1;
      vi1 = *fvi;
      if (vi0 < vi1)
      {
        edges[edge_count].i = vi0;
        edges[edge_count++].j = vi1;
      }
      else if (vi0 > vi1)
      {
        edges[edge_count].i = vi1;
        edges[edge_count++].j = vi0;
      }
    }
  }

  if (edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]),compare2u);

  unsigned int bdry_edge_count = 0;
  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    const ON_2udex e0 = edges[i++];
    if (i < edge_count && e0.i == edges[i].i && e0.j == edges[i].j)
    {
      // not a boundary edge
      for (i++; i < edge_count; i++)
      {
        if (e0.i != edges[i].i || e0.j != edges[i].j)
          break;
      }
    }
    else
    {
      edges[bdry_edge_count++] = e0;
    }
  }

  if (bdry_edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_SortUnsignedIntArray( ON::sort_algorithm::quick_sort, workspace, 2*bdry_edge_count );

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if ( nullptr == ON_BinarySearchUnsignedIntArray( ngon->m_vi[nvi], workspace, 2*bdry_edge_count) )
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  // It is possible that the ngon is still not valid.
  //
  // If bdry_edge_count > ngon->m_Vcount, then there "could" be one or
  // more inner "holes" and the ngon->m_vi[] could reference a vertex
  // on an inner boundary.
  //
  // The vertices in ngon->m_v[] may not be a proper outer boundary.
  //
  // ...


  return bdry_edge_count;
}